

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

void __thiscall
calculator::ExpressionParser<__int128>::expect(ExpressionParser<__int128> *this,string *str)

{
  ulong uVar1;
  int iVar2;
  string *psVar3;
  long lVar4;
  ulong in_RDI;
  ExpressionParser<__int128> *in_stack_000001e0;
  
  uVar1 = *(ulong *)(in_RDI + 0x20);
  psVar3 = (string *)std::__cxx11::string::size();
  iVar2 = std::__cxx11::string::compare(in_RDI,uVar1,psVar3);
  if (iVar2 != 0) {
    unexpected(in_stack_000001e0);
  }
  lVar4 = std::__cxx11::string::size();
  *(long *)(in_RDI + 0x20) = lVar4 + *(long *)(in_RDI + 0x20);
  return;
}

Assistant:

void expect(const std::string& str)
  {
    if (expr_.compare(index_, str.size(), str) != 0)
      unexpected();
    index_ += str.size();
  }